

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O1

string * __thiscall
iDynTree::Position::toString_abi_cxx11_(string *__return_storage_ptr__,Position *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>((this->super_Vector3).m_data[2]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Position::toString() const
    {
        std::stringstream ss;
        ss << this->m_data[0] << " " << this->m_data[1] << " " << this->m_data[2];
        return ss.str();
    }